

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall QPDFArgParser::handleBashArguments(QPDFArgParser *this)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var4;
  pointer psVar5;
  long lVar6;
  element_type *peVar7;
  int iVar8;
  pointer psVar9;
  size_type sVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  ulong i;
  string arg;
  allocator<char> local_99;
  shared_ptr<const_char> local_98;
  string local_88;
  string local_68;
  pointer local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  peVar7 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = (peVar7->bash_line)._M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (peVar7->bash_line)._M_dataplus._M_p;
    sVar10 = 0;
    bVar14 = false;
    iVar13 = 0;
    do {
      bVar1 = pcVar3[sVar10];
      iVar8 = iVar13;
      if (bVar14) {
        bVar14 = false;
        std::__cxx11::string::_M_replace_aux((ulong)&local_88,local_88._M_string_length,0,'\x01');
      }
      else {
        bVar14 = true;
        if (bVar1 != 0x5c) {
          if (iVar13 == 2) {
            bVar14 = false;
            iVar8 = 0;
            if (bVar1 != 0x22) {
LAB_0015e5b6:
              bVar14 = false;
              std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_88,local_88._M_string_length,0,'\x01');
              iVar8 = iVar13;
            }
          }
          else if (iVar13 == 1) {
            bVar14 = false;
            iVar8 = 0;
            if (bVar1 != 0x27) goto LAB_0015e5b6;
          }
          else {
            if (bVar1 < 0x20) {
              if (4 < bVar1 - 9) goto LAB_0015e5b6;
LAB_0015e5ec:
              if (local_88._M_string_length != 0) {
                peVar7 = (this->m).
                         super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                QUtil::make_shared_cstr((QUtil *)&local_98,&local_88);
                local_68._M_dataplus._M_p =
                     local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_68._M_string_length =
                     (size_type)
                     local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi;
                local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (pointer)0x0;
                local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>
                ::emplace_back<std::shared_ptr<char_const>>
                          ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>
                            *)&peVar7->bash_argv,(shared_ptr<const_char> *)&local_68);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_68._M_string_length);
                }
                if (local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_88._M_string_length = 0;
                *local_88._M_dataplus._M_p = '\0';
              }
              iVar8 = 0;
            }
            else if (bVar1 == 0x27) {
              iVar8 = 1;
            }
            else {
              if (bVar1 != 0x22) {
                if (bVar1 == 0x20) goto LAB_0015e5ec;
                goto LAB_0015e5b6;
              }
              iVar8 = 2;
            }
            bVar14 = false;
          }
        }
      }
      iVar13 = iVar8;
      sVar10 = sVar10 + 1;
    } while (sVar2 != sVar10);
    peVar7 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
  }
  psVar9 = (peVar7->bash_argv).
           super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = *(pointer *)
            ((long)&(peVar7->bash_argv).
                    super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (psVar9 == psVar5) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,*peVar7->argv,&local_99);
    QUtil::make_shared_cstr((QUtil *)&local_48,&local_68);
    local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
    local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Stack_40;
    local_48 = (pointer)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
    emplace_back<std::shared_ptr<char_const>>
              ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>> *)
               &peVar7->bash_argv,&local_98);
    if (local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    peVar7 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    psVar9 = (peVar7->bash_argv).
             super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = *(pointer *)
              ((long)&(peVar7->bash_argv).
                      super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
  }
  lVar6 = (long)psVar5 - (long)psVar9 >> 4;
  local_68._M_dataplus._M_p =
       (pointer)operator_new__(-(ulong)(lVar6 + 1U >> 0x3d != 0) | lVar6 * 8 + 8U);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<char_const**,std::default_delete<char_const*[]>,std::allocator<void>,void>();
  sVar2 = local_68._M_string_length;
  _Var4._M_p = local_68._M_dataplus._M_p;
  peVar7 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  this_00 = (peVar7->bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (peVar7->bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var4._M_p;
  (peVar7->bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
  }
  peVar7 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar9 = (peVar7->bash_argv).
           super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(peVar7->bash_argv).
               super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
               ._M_impl.super__Vector_impl_data + 8) == psVar9) {
    i = 0;
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    uVar11 = 0;
    do {
      (peVar7->bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      [uVar11] = *(element_type *)
                  ((long)&(psVar9->super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + lVar6);
      uVar11 = uVar11 + 1;
      peVar7 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      psVar9 = (peVar7->bash_argv).
               super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)*(pointer *)
                      ((long)&(peVar7->bash_argv).
                              super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                              ._M_impl.super__Vector_impl_data + 8) - (long)psVar9;
      i = (long)uVar12 >> 4;
      lVar6 = lVar6 + 0x10;
    } while (uVar11 < i);
    lVar6 = (long)(int)(uVar12 >> 4);
  }
  if (i >> 0x1f != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
    peVar7 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
  }
  peVar7->argc = (int)i;
  (peVar7->bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr[lVar6]
       = (element_type)0x0;
  peVar7 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar7->argv = (peVar7->bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDFArgParser::handleBashArguments()
{
    // Do a minimal job of parsing bash_line into arguments. This doesn't do everything the shell
    // does (e.g. $(...), variable expansion, arithmetic, globs, etc.), but it should be good enough
    // for purposes of handling completion. As we build up the new argv, we can't use m->new_argv
    // because this code has to interoperate with @file arguments, so memory for both ways of
    // fabricating argv has to be protected.

    bool last_was_backslash = false;
    enum { st_top, st_squote, st_dquote } state = st_top;
    std::string arg;
    for (char ch: m->bash_line) {
        if (last_was_backslash) {
            arg.append(1, ch);
            last_was_backslash = false;
        } else if (ch == '\\') {
            last_was_backslash = true;
        } else {
            bool append = false;
            switch (state) {
            case st_top:
                if (util::is_space(ch)) {
                    if (!arg.empty()) {
                        m->bash_argv.push_back(QUtil::make_shared_cstr(arg));
                        arg.clear();
                    }
                } else if (ch == '"') {
                    state = st_dquote;
                } else if (ch == '\'') {
                    state = st_squote;
                } else {
                    append = true;
                }
                break;

            case st_squote:
                if (ch == '\'') {
                    state = st_top;
                } else {
                    append = true;
                }
                break;

            case st_dquote:
                if (ch == '"') {
                    state = st_top;
                } else {
                    append = true;
                }
                break;
            }
            if (append) {
                arg.append(1, ch);
            }
        }
    }
    if (m->bash_argv.empty()) {
        // This can't happen if properly invoked by bash, but ensure we have a valid argv[0]
        // regardless.
        m->bash_argv.push_back(QUtil::make_shared_cstr(m->argv[0]));
    }
    // Explicitly discard any non-space-terminated word. The "current word" is handled specially.
    m->bash_argv_ph = QUtil::make_shared_array<char const*>(1 + m->bash_argv.size());
    for (size_t i = 0; i < m->bash_argv.size(); ++i) {
        m->bash_argv_ph.get()[i] = m->bash_argv.at(i).get();
    }
    m->argc = QIntC::to_int(m->bash_argv.size());
    m->bash_argv_ph.get()[m->argc] = nullptr;
    m->argv = m->bash_argv_ph.get();
}